

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall
cs::compiler_type::translate_into_tokens
          (compiler_type *this,deque<char,_std::allocator<char>_> *char_buff,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,charset encoding)

{
  preprocessor local_b0;
  
  preprocessor::preprocessor(&local_b0,&this->context,this,char_buff,tokens,encoding);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.line._M_dataplus._M_p != &local_b0.line.field_2) {
    operator_delete(local_b0.line._M_dataplus._M_p,local_b0.line.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.command._M_dataplus._M_p != &local_b0.command.field_2) {
    operator_delete(local_b0.command._M_dataplus._M_p,
                    local_b0.command.field_2._M_allocated_capacity + 1);
  }
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base
            (&local_b0.buff.super__Deque_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void compiler_type::translate_into_tokens(const std::deque<char> &char_buff, std::deque<token_base *> &tokens,
	        charset encoding)
	{
		preprocessor(context, *this, char_buff, tokens, encoding);
	}